

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashList_Serialize(ktxHashList *pHead,uint *pKvdLen,uchar **ppKvd)

{
  uint in_EAX;
  uint *puVar1;
  uint uVar2;
  ktx_error_code_e kVar3;
  size_t __n;
  ktxHashList pkVar4;
  uchar *puVar5;
  float fVar6;
  undefined1 auVar7 [16];
  char padding [4];
  undefined8 uStack_38;
  
  kVar3 = KTX_INVALID_VALUE;
  if (ppKvd != (uchar **)0x0 && (pKvdLen != (uint *)0x0 && pHead != (ktxHashList *)0x0)) {
    uStack_38 = (ulong)in_EAX;
    uVar2 = 0;
    for (pkVar4 = *pHead; pkVar4 != (ktxHashList)0x0; pkVar4 = (ktxHashList)(pkVar4->hh).next) {
      auVar7 = ZEXT416((uint)((float)(pkVar4->keyLen + pkVar4->valueLen + 4) * 0.25));
      auVar7 = roundss(auVar7,auVar7,10);
      uVar2 = uVar2 + (int)(long)(auVar7._0_4_ * 4.0);
    }
    if (uVar2 == 0) {
      *pKvdLen = 0;
      *ppKvd = (uchar *)0x0;
      kVar3 = KTX_SUCCESS;
    }
    else {
      puVar1 = (uint *)malloc((ulong)uVar2);
      if (puVar1 == (uint *)0x0) {
        kVar3 = KTX_OUT_OF_MEMORY;
      }
      else {
        *pKvdLen = uVar2;
        *ppKvd = (uchar *)puVar1;
        pkVar4 = *pHead;
        kVar3 = KTX_SUCCESS;
        if (pkVar4 != (ktxHashList)0x0) {
          do {
            uVar2 = pkVar4->valueLen + pkVar4->keyLen;
            *puVar1 = uVar2;
            memcpy(puVar1 + 1,pkVar4->key,(ulong)pkVar4->keyLen);
            puVar5 = (uchar *)((long)puVar1 + (ulong)pkVar4->keyLen + 4);
            if ((ulong)pkVar4->valueLen != 0) {
              memcpy(puVar5,pkVar4->value,(ulong)pkVar4->valueLen);
            }
            puVar5 = puVar5 + pkVar4->valueLen;
            fVar6 = (float)uVar2;
            auVar7 = ZEXT416((uint)(fVar6 * 0.25));
            auVar7 = roundss(auVar7,auVar7,10);
            __n = (size_t)(int)(long)(auVar7._0_4_ * 4.0 - fVar6);
            memcpy(puVar5,(void *)((long)&uStack_38 + 4),__n);
            puVar1 = (uint *)(puVar5 + __n);
            pkVar4 = (ktxHashList)(pkVar4->hh).next;
          } while (pkVar4 != (ktxHashList)0x0);
        }
      }
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxHashList_Serialize(ktxHashList* pHead,
                      unsigned int* pKvdLen, unsigned char** ppKvd)
{

    if (pHead && pKvdLen && ppKvd) {
        ktxKVListEntry* kv;
        unsigned int bytesOfKeyValueData = 0;
        unsigned int keyValueLen;
        unsigned char* sd;
        char padding[4] = {0, 0, 0, 0};

        for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
            /* sizeof(sd) is to make space to write keyAndValueByteSize */
            keyValueLen = kv->keyLen + kv->valueLen + sizeof(ktx_uint32_t);
            /* Add valuePadding */
            keyValueLen = _KTX_PAD4(keyValueLen);
            bytesOfKeyValueData += keyValueLen;
        }

        if (bytesOfKeyValueData == 0) {
            *pKvdLen = 0;
            *ppKvd = NULL;
        } else {
            sd = malloc(bytesOfKeyValueData);
            if (!sd)
                return KTX_OUT_OF_MEMORY;

            *pKvdLen = bytesOfKeyValueData;
            *ppKvd = sd;

            for (kv = *pHead; kv != NULL; kv = kv->hh.next) {
                int padLen;

                keyValueLen = kv->keyLen + kv->valueLen;
                *(ktx_uint32_t*)sd = keyValueLen;
                sd += sizeof(ktx_uint32_t);
                memcpy(sd, kv->key, kv->keyLen);
                sd += kv->keyLen;
                if (kv->valueLen > 0)
                    memcpy(sd, kv->value, kv->valueLen);
                sd += kv->valueLen;
                padLen = _KTX_PAD4_LEN(keyValueLen);
                memcpy(sd, padding, padLen);
                sd += padLen;
            }
        }
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}